

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O1

void term_size(Terminal *term,wchar_t newrows,wchar_t newcols,wchar_t newsavelines)

{
  wchar_t which;
  termchar *ptVar1;
  Backend *pBVar2;
  wchar_t wVar3;
  wchar_t index;
  wchar_t wVar4;
  int index_00;
  wchar_t wVar5;
  tree234 *ptVar6;
  compressed_scrollback_line *pcVar7;
  termline *ptVar8;
  void *pvVar9;
  termline **pptVar10;
  uchar *puVar11;
  long lVar12;
  wchar_t wVar13;
  wchar_t cols;
  ulong uVar14;
  ulong uVar15;
  
  wVar13 = term->rows;
  which = term->alt_which;
  if (((wVar13 != newrows) || (term->cols != newcols)) || (term->savelines != newsavelines)) {
    if (newrows < L'\x02') {
      newrows = L'\x01';
    }
    cols = L'\x01';
    if (L'\x01' < newcols) {
      cols = newcols;
    }
    term->selstate = LEXICOGRAPHIC;
    (term->selstart).y = L'\0';
    (term->selstart).x = L'\0';
    (term->selend).y = L'\0';
    (term->selend).x = L'\0';
    swap_screen(term,L'\0',false,false);
    term->marg_t = L'\0';
    term->alt_t = L'\0';
    wVar3 = newrows + L'\xffffffff';
    term->marg_b = wVar3;
    term->alt_b = wVar3;
    if (term->rows == L'\xffffffff') {
      ptVar6 = newtree234((cmpfn234_conflict)0x0);
      term->scrollback = ptVar6;
      ptVar6 = newtree234((cmpfn234_conflict)0x0);
      term->screen = ptVar6;
      term->tempsblines = L'\0';
      term->rows = L'\0';
    }
    index = count234(term->scrollback);
    wVar5 = term->rows;
    wVar4 = count234(term->screen);
    if (wVar5 != wVar4) {
      __assert_fail("term->rows == count234(term->screen)",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                    ,0x88d,"void term_size(Terminal *, int, int, int)");
    }
    wVar5 = term->rows;
    while (wVar5 < newrows) {
      if (term->tempsblines < L'\x01') {
        ptVar8 = newtermline(term,cols,false);
        ptVar6 = term->screen;
        index_00 = count234(ptVar6);
        addpos234(ptVar6,ptVar8,index_00);
      }
      else {
        if (index < term->tempsblines) {
          __assert_fail("sblen >= term->tempsblines",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                        ,0x892,"void term_size(Terminal *, int, int, int)");
        }
        index = index + L'\xffffffff';
        pcVar7 = (compressed_scrollback_line *)delpos234(term->scrollback,index);
        ptVar8 = decompressline(pcVar7);
        safefree(pcVar7);
        ptVar8->temporary = false;
        term->tempsblines = term->tempsblines + L'\xffffffff';
        addpos234(term->screen,ptVar8,0);
        (term->curs).y = (term->curs).y + L'\x01';
        (term->savecurs).y = (term->savecurs).y + L'\x01';
        term->alt_y = term->alt_y + L'\x01';
        (term->alt_savecurs).y = (term->alt_savecurs).y + L'\x01';
      }
      wVar5 = term->rows + L'\x01';
      term->rows = wVar5;
    }
    wVar5 = term->rows;
    while (newrows < wVar5) {
      if ((term->curs).y < wVar5 + L'\xffffffff') {
        ptVar8 = (termline *)delpos234(term->screen,wVar5 + L'\xffffffff');
        freetermline(ptVar8);
        wVar4 = index;
      }
      else {
        ptVar8 = (termline *)delpos234(term->screen,0);
        ptVar6 = term->scrollback;
        pcVar7 = compressline(ptVar8);
        wVar4 = index + L'\x01';
        addpos234(ptVar6,pcVar7,index);
        freetermline(ptVar8);
        term->tempsblines = term->tempsblines + L'\x01';
        (term->curs).y = (term->curs).y + L'\xffffffff';
        (term->savecurs).y = (term->savecurs).y + L'\xffffffff';
        term->alt_y = term->alt_y + L'\xffffffff';
        (term->alt_savecurs).y = (term->alt_savecurs).y + L'\xffffffff';
      }
      wVar5 = term->rows + L'\xffffffff';
      term->rows = wVar5;
      index = wVar4;
    }
    if (wVar5 != newrows) {
      __assert_fail("term->rows == newrows",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                    ,0x8b7,"void term_size(Terminal *, int, int, int)");
    }
    wVar4 = count234(term->screen);
    wVar5 = index;
    if (wVar4 != newrows) {
      __assert_fail("count234(term->screen) == newrows",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                    ,0x8b8,"void term_size(Terminal *, int, int, int)");
    }
    for (; newsavelines < index; index = index + L'\xffffffff') {
      pvVar9 = delpos234(term->scrollback,0);
      safefree(pvVar9);
      wVar5 = newsavelines;
    }
    if (wVar5 < term->tempsblines) {
      term->tempsblines = wVar5;
    }
    wVar5 = count234(term->scrollback);
    if (newsavelines < wVar5) {
      __assert_fail("count234(term->scrollback) <= newsavelines",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                    ,0x8c2,"void term_size(Terminal *, int, int, int)");
    }
    wVar5 = count234(term->scrollback);
    if (wVar5 < term->tempsblines) {
      __assert_fail("count234(term->scrollback) >= term->tempsblines",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                    ,0x8c3,"void term_size(Terminal *, int, int, int)");
    }
    term->disptop = L'\0';
    uVar14 = 0;
    pptVar10 = (termline **)safemalloc((ulong)(uint)newrows,8,0);
    uVar15 = 1;
    if (L'\x01' < newcols) {
      uVar15 = (ulong)(uint)newcols;
    }
    do {
      ptVar8 = newtermline(term,cols,false);
      pptVar10[uVar14] = ptVar8;
      ptVar1 = ptVar8->chars;
      lVar12 = 0;
      do {
        *(undefined8 *)((long)&ptVar1->attr + lVar12) = 0x3ffff;
        lVar12 = lVar12 + 0x20;
      } while (uVar15 * 0x20 != lVar12);
      uVar14 = uVar14 + 1;
    } while (uVar14 != (uint)newrows);
    if (L'\0' < wVar13 && term->disptext != (termline **)0x0) {
      uVar14 = 0;
      do {
        freetermline(term->disptext[uVar14]);
        uVar14 = uVar14 + 1;
      } while ((uint)wVar13 != uVar14);
    }
    safefree(term->disptext);
    term->disptext = pptVar10;
    term->dispcursx = L'\xffffffff';
    term->dispcursy = L'\xffffffff';
    wVar13 = L'\0';
    ptVar6 = newtree234((cmpfn234_conflict)0x0);
    do {
      ptVar8 = newtermline(term,cols,true);
      addpos234(ptVar6,ptVar8,wVar13);
      wVar13 = wVar13 + L'\x01';
    } while (newrows != wVar13);
    if (term->alt_screen != (tree234 *)0x0) {
      pvVar9 = delpos234(term->alt_screen,0);
      while (pvVar9 != (void *)0x0) {
        safefree(*(void **)((long)pvVar9 + 0x18));
        safefree(pvVar9);
        pvVar9 = delpos234(term->alt_screen,0);
      }
      freetree234(term->alt_screen);
    }
    term->alt_screen = ptVar6;
    term->alt_sblines = L'\0';
    puVar11 = (uchar *)saferealloc(term->tabs,(ulong)(uint)cols,1);
    term->tabs = puVar11;
    wVar13 = term->cols;
    if (wVar13 < cols) {
      uVar14 = 0;
      if (L'\0' < wVar13) {
        uVar14 = (ulong)(uint)wVar13;
      }
      do {
        term->tabs[uVar14] = (uVar14 & 7) == 0;
        uVar14 = uVar14 + 1;
      } while ((wchar_t)uVar14 < newcols);
    }
    if ((term->savecurs).y < L'\0') {
      (term->savecurs).y = L'\0';
    }
    if (newrows <= (term->savecurs).y) {
      (term->savecurs).y = wVar3;
    }
    if (cols <= (term->savecurs).x) {
      (term->savecurs).x = cols + L'\xffffffff';
    }
    if ((term->alt_savecurs).y < L'\0') {
      (term->alt_savecurs).y = L'\0';
    }
    if (newrows <= (term->alt_savecurs).y) {
      (term->alt_savecurs).y = wVar3;
    }
    if (cols <= (term->alt_savecurs).x) {
      (term->alt_savecurs).x = cols + L'\xffffffff';
    }
    if ((term->curs).y < L'\0') {
      (term->curs).y = L'\0';
    }
    if (newrows <= (term->curs).y) {
      (term->curs).y = wVar3;
    }
    if (cols <= (term->curs).x) {
      (term->curs).x = cols + L'\xffffffff';
    }
    if (term->alt_y < L'\0') {
      term->alt_y = L'\0';
    }
    if (newrows <= term->alt_y) {
      term->alt_y = wVar3;
    }
    if (cols <= term->alt_x) {
      term->alt_x = cols + L'\xffffffff';
    }
    term->wrapnext = false;
    term->alt_wnext = false;
    term->alt_x = L'\0';
    term->alt_y = L'\0';
    term->rows = newrows;
    term->cols = cols;
    term->savelines = newsavelines;
    swap_screen(term,which,false,false);
    term->win_scrollbar_update_pending = true;
    if (term->window_update_pending == false) {
      term->window_update_pending = true;
      queue_toplevel_callback(term_update_callback,term);
    }
    pBVar2 = term->backend;
    if (pBVar2 != (Backend *)0x0) {
      (*pBVar2->vt->size)(pBVar2,term->cols,term->rows);
      return;
    }
  }
  return;
}

Assistant:

void term_size(Terminal *term, int newrows, int newcols, int newsavelines)
{
    tree234 *newalt;
    termline **newdisp, *line;
    int i, j, oldrows = term->rows;
    int sblen;
    int save_alt_which = term->alt_which;

    if (newrows == term->rows && newcols == term->cols &&
        newsavelines == term->savelines)
        return;                        /* nothing to do */

    /* Behave sensibly if we're given zero (or negative) rows/cols */

    if (newrows < 1) newrows = 1;
    if (newcols < 1) newcols = 1;

    deselect(term);
    swap_screen(term, 0, false, false);

    term->alt_t = term->marg_t = 0;
    term->alt_b = term->marg_b = newrows - 1;

    if (term->rows == -1) {
        term->scrollback = newtree234(NULL);
        term->screen = newtree234(NULL);
        term->tempsblines = 0;
        term->rows = 0;
    }

    /*
     * Resize the screen and scrollback. We only need to shift
     * lines around within our data structures, because lineptr()
     * will take care of resizing each individual line if
     * necessary. So:
     *
     *  - If the new screen is longer, we shunt lines in from temporary
     *    scrollback if possible, otherwise we add new blank lines at
     *    the bottom.
     *
     *  - If the new screen is shorter, we remove any blank lines at
     *    the bottom if possible, otherwise shunt lines above the cursor
     *    to scrollback if possible, otherwise delete lines below the
     *    cursor.
     *
     *  - Then, if the new scrollback length is less than the
     *    amount of scrollback we actually have, we must throw some
     *    away.
     */
    sblen = count234(term->scrollback);
    /* Do this loop to expand the screen if newrows > rows */
    assert(term->rows == count234(term->screen));
    while (term->rows < newrows) {
        if (term->tempsblines > 0) {
            compressed_scrollback_line *cline;
            /* Insert a line from the scrollback at the top of the screen. */
            assert(sblen >= term->tempsblines);
            cline = delpos234(term->scrollback, --sblen);
            line = decompressline(cline);
            sfree(cline);
            line->temporary = false;   /* reconstituted line is now real */
            term->tempsblines -= 1;
            addpos234(term->screen, line, 0);
            term->curs.y += 1;
            term->savecurs.y += 1;
            term->alt_y += 1;
            term->alt_savecurs.y += 1;
        } else {
            /* Add a new blank line at the bottom of the screen. */
            line = newtermline(term, newcols, false);
            addpos234(term->screen, line, count234(term->screen));
        }
        term->rows += 1;
    }
    /* Do this loop to shrink the screen if newrows < rows */
    while (term->rows > newrows) {
        if (term->curs.y < term->rows - 1) {
            /* delete bottom row, unless it contains the cursor */
            line = delpos234(term->screen, term->rows - 1);
            freetermline(line);
        } else {
            /* push top row to scrollback */
            line = delpos234(term->screen, 0);
            addpos234(term->scrollback, compressline(line), sblen++);
            freetermline(line);
            term->tempsblines += 1;
            term->curs.y -= 1;
            term->savecurs.y -= 1;
            term->alt_y -= 1;
            term->alt_savecurs.y -= 1;
        }
        term->rows -= 1;
    }
    assert(term->rows == newrows);
    assert(count234(term->screen) == newrows);

    /* Delete any excess lines from the scrollback. */
    while (sblen > newsavelines) {
        line = delpos234(term->scrollback, 0);
        sfree(line);
        sblen--;
    }
    if (sblen < term->tempsblines)
        term->tempsblines = sblen;
    assert(count234(term->scrollback) <= newsavelines);
    assert(count234(term->scrollback) >= term->tempsblines);
    term->disptop = 0;

    /* Make a new displayed text buffer. */
    newdisp = snewn(newrows, termline *);
    for (i = 0; i < newrows; i++) {
        newdisp[i] = newtermline(term, newcols, false);
        for (j = 0; j < newcols; j++)
            newdisp[i]->chars[j].attr = ATTR_INVALID;
    }
    if (term->disptext) {
        for (i = 0; i < oldrows; i++)
            freetermline(term->disptext[i]);
    }
    sfree(term->disptext);
    term->disptext = newdisp;
    term->dispcursx = term->dispcursy = -1;

    /* Make a new alternate screen. */
    newalt = newtree234(NULL);
    for (i = 0; i < newrows; i++) {
        line = newtermline(term, newcols, true);
        addpos234(newalt, line, i);
    }
    if (term->alt_screen) {
        while (NULL != (line = delpos234(term->alt_screen, 0)))
            freetermline(line);
        freetree234(term->alt_screen);
    }
    term->alt_screen = newalt;
    term->alt_sblines = 0;

    term->tabs = sresize(term->tabs, newcols, unsigned char);
    {
        int i;
        for (i = (term->cols > 0 ? term->cols : 0); i < newcols; i++)
            term->tabs[i] = (i % 8 == 0 ? true : false);
    }

    /* Check that the cursor positions are still valid. */
    if (term->savecurs.y < 0)
        term->savecurs.y = 0;
    if (term->savecurs.y >= newrows)
        term->savecurs.y = newrows - 1;
    if (term->savecurs.x >= newcols)
        term->savecurs.x = newcols - 1;
    if (term->alt_savecurs.y < 0)
        term->alt_savecurs.y = 0;
    if (term->alt_savecurs.y >= newrows)
        term->alt_savecurs.y = newrows - 1;
    if (term->alt_savecurs.x >= newcols)
        term->alt_savecurs.x = newcols - 1;
    if (term->curs.y < 0)
        term->curs.y = 0;
    if (term->curs.y >= newrows)
        term->curs.y = newrows - 1;
    if (term->curs.x >= newcols)
        term->curs.x = newcols - 1;
    if (term->alt_y < 0)
        term->alt_y = 0;
    if (term->alt_y >= newrows)
        term->alt_y = newrows - 1;
    if (term->alt_x >= newcols)
        term->alt_x = newcols - 1;
    term->alt_x = term->alt_y = 0;
    term->wrapnext = false;
    term->alt_wnext = false;

    term->rows = newrows;
    term->cols = newcols;
    term->savelines = newsavelines;

    swap_screen(term, save_alt_which, false, false);

    term->win_scrollbar_update_pending = true;
    term_schedule_update(term);
    if (term->backend)
        backend_size(term->backend, term->cols, term->rows);
}